

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

void __thiscall kj::anon_unknown_123::AsyncTee::Branch::~Branch(Branch *this)

{
  bool bVar1;
  AsyncTee *pAVar2;
  Fault local_70;
  Fault f_1;
  undefined1 local_60 [8];
  DebugComparison<kj::Maybe<kj::(anonymous_namespace)::AsyncTee::Sink_&>_&,_const_kj::None_&>
  _kjCondition_1;
  Fault local_30;
  Fault f;
  bool local_12;
  DebugExpression<bool> local_11;
  Branch *pBStack_10;
  DebugExpression<bool> _kjCondition;
  Branch *this_local;
  
  pBStack_10 = this;
  local_12 = ListLink<kj::(anonymous_namespace)::AsyncTee::Branch>::isLinked(&this->link);
  local_11 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_12);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_11);
  if (bVar1) {
    pAVar2 = Own<kj::(anonymous_namespace)::AsyncTee,_std::nullptr_t>::operator->(&this->tee);
    List<kj::(anonymous_namespace)::AsyncTee::Branch,_&kj::(anonymous_namespace)::AsyncTee::Branch::link>
    ::remove(&pAVar2->branches,(char *)this);
    f_1.exception =
         (Exception *)
         kj::_::DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&this->sink);
    kj::_::DebugExpression<kj::Maybe<kj::(anonymous_namespace)::AsyncTee::Sink&>&>::operator==
              ((DebugComparison<kj::Maybe<kj::(anonymous_namespace)::AsyncTee::Sink_&>_&,_const_kj::None_&>
                *)local_60,
               (DebugExpression<kj::Maybe<kj::(anonymous_namespace)::AsyncTee::Sink&>&> *)&f_1,
               (None *)&kj::none);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_60);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::(anonymous_namespace)::AsyncTee::Sink&>&,kj::None_const&>&,char_const(&)[83]>
                (&local_70,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                 ,0x705,FAILED,"sink == kj::none",
                 "_kjCondition,\"destroying tee branch with operation still in-progress; probably going to segfault\""
                 ,(DebugComparison<kj::Maybe<kj::(anonymous_namespace)::AsyncTee::Sink_&>_&,_const_kj::None_&>
                   *)local_60,
                 (char (*) [83])
                 "destroying tee branch with operation still in-progress; probably going to segfault"
                );
      _kjCondition_1._36_4_ = 5;
      kj::_::Debug::Fault::~Fault(&local_70);
    }
    _kjCondition_1._36_4_ = 0;
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              (&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
               ,0x6fe,FAILED,"link.isLinked()","_kjCondition,",&local_11);
    _kjCondition_1._36_4_ = 1;
    kj::_::Debug::Fault::~Fault(&local_30);
  }
  Buffer::~Buffer(&this->buffer);
  ListLink<kj::(anonymous_namespace)::AsyncTee::Branch>::~ListLink(&this->link);
  Own<kj::(anonymous_namespace)::AsyncTee,_std::nullptr_t>::~Own(&this->tee);
  AsyncInputStream::~AsyncInputStream(&this->super_AsyncInputStream);
  return;
}

Assistant:

~Branch() noexcept(false) {
      KJ_ASSERT(link.isLinked()) {
        // Don't std::terminate().
        return;
      }
      tee->branches.remove(*this);

      KJ_REQUIRE(sink == kj::none,
          "destroying tee branch with operation still in-progress; probably going to segfault") {
        // Don't std::terminate().
        break;
      }
    }